

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cpp
# Opt level: O3

string * __thiscall
sqlite::Connection::Stmt::get_col<std::__cxx11::string>
          (string *__return_storage_ptr__,Stmt *this,int column)

{
  char *__s;
  size_t sVar1;
  
  __s = (char *)sqlite3_column_text(this->stmt_,column);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (__s == (char *)0x0) {
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    sVar1 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,__s,__s + sVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Connection::Stmt::get_col<std::string>(const int column)
    {
        const char * str = reinterpret_cast<const char *>(sqlite3_column_text(stmt_, column));

        if(!str)
            return ""s; // empty str for NULL data
        else
            return std::string(str);
    }